

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
fasttext::Meter::precisionRecallCurve(Meter *this,int32_t labelId)

{
  double dVar1;
  bool bVar2;
  pointer ppVar3;
  int in_EDX;
  uint64_t *in_RSI;
  pair<unsigned_long,_unsigned_long> *in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double recall;
  double falsePositives;
  double truePositives;
  double precision;
  const_iterator it;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  fullRecall;
  uint64_t golds;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *positiveCounts;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  *precisionRecallCurve;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  in_stack_fffffffffffffef8;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *in_stack_ffffffffffffff00;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  in_stack_ffffffffffffff08;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  in_stack_ffffffffffffff10;
  mapped_type *in_stack_ffffffffffffff18;
  pair<unsigned_long,_unsigned_long> *ppVar7;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  __last;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Var8;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_88;
  pair<unsigned_long,_unsigned_long> *local_80;
  pair<unsigned_long,_unsigned_long> *local_78;
  pair<unsigned_long,_unsigned_long> *local_70;
  pair<unsigned_long,_unsigned_long> *local_68;
  undefined8 in_stack_ffffffffffffffa0;
  int32_t labelId_00;
  Meter *in_stack_ffffffffffffffa8;
  undefined1 local_38 [24];
  undefined1 *local_20;
  byte local_15;
  int local_14;
  
  labelId_00 = (int32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_15 = 0;
  _Var8._M_current = in_RDI;
  local_14 = in_EDX;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             0x1dcb35);
  getPositiveCounts(in_stack_ffffffffffffffa8,labelId_00);
  local_20 = local_38;
  bVar2 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::empty((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)in_stack_ffffffffffffff10._M_current);
  if (!bVar2) {
    if (local_14 == -1) {
      ppVar7 = (pair<unsigned_long,_unsigned_long> *)*in_RSI;
    }
    else {
      in_stack_ffffffffffffff18 =
           std::
           unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
           ::at(in_stack_ffffffffffffff00,(key_type *)in_stack_fffffffffffffef8._M_current);
      ppVar7 = (pair<unsigned_long,_unsigned_long> *)in_stack_ffffffffffffff18->gold;
    }
    __last._M_current = ppVar7;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffffef8._M_current);
    local_68 = (pair<unsigned_long,_unsigned_long> *)
               std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::end(in_stack_fffffffffffffef8._M_current);
    in_stack_ffffffffffffff10 =
         std::
         lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,unsigned_long,bool(*)(std::pair<double,double>const&,double_const&)>
                   (_Var8,__last,&in_stack_ffffffffffffff18->gold,
                    in_stack_ffffffffffffff10._M_current);
    _Var8 = in_stack_ffffffffffffff10;
    local_70 = (pair<unsigned_long,_unsigned_long> *)
               std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::end(in_stack_fffffffffffffef8._M_current);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffef8._M_current);
    if (bVar2) {
      local_80 = _Var8._M_current;
      in_stack_ffffffffffffff08 =
           std::
           next<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>>
                     (in_stack_fffffffffffffef8,0x1dcca8);
      local_78 = in_stack_ffffffffffffff08._M_current;
    }
    local_88._M_current =
         (pair<unsigned_long,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::begin(in_stack_fffffffffffffef8._M_current);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                               *)in_stack_ffffffffffffff00,
                              (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                               *)in_stack_fffffffffffffef8._M_current), bVar2) {
      auVar5 = (undefined1  [16])0x0;
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator->(&local_88);
      auVar5 = vcvtusi2sd_avx512f(auVar5,ppVar3->first);
      dVar4 = auVar5._0_8_;
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator->(&local_88);
      auVar5 = vcvtusi2sd_avx512f(auVar5,ppVar3->second);
      dVar1 = dVar4 + auVar5._0_8_;
      auVar6 = (undefined1  [16])0x0;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = dVar4 + auVar5._0_8_;
      }
      if (ppVar7 == (pair<unsigned_long,_unsigned_long> *)0x0) {
        in_stack_ffffffffffffff00 =
             (unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
              *)std::numeric_limits<double>::quiet_NaN();
      }
      else {
        auVar5 = vcvtusi2sd_avx512f(auVar6,ppVar7);
        in_stack_ffffffffffffff00 =
             (unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
              *)(dVar4 / auVar5._0_8_);
      }
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double&,double&>
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 in_stack_ffffffffffffff10._M_current,(double *)in_stack_ffffffffffffff08._M_current
                 ,(double *)in_stack_ffffffffffffff00);
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::operator++((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)in_stack_ffffffffffffff08._M_current,
                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    }
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               in_stack_ffffffffffffff10._M_current,(double *)in_stack_ffffffffffffff08._M_current,
               (double *)in_stack_ffffffffffffff00);
  }
  local_15 = 1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_ffffffffffffff10._M_current);
  if ((local_15 & 1) == 0) {
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               in_stack_ffffffffffffff10._M_current);
  }
  return (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)in_RDI;
}

Assistant:

std::vector<std::pair<double, double>> Meter::precisionRecallCurve(
    int32_t labelId) const {
  std::vector<std::pair<double, double>> precisionRecallCurve;
  const auto& positiveCounts = getPositiveCounts(labelId);
  if (positiveCounts.empty()) {
    return precisionRecallCurve;
  }

  uint64_t golds =
      (labelId == kAllLabels) ? metrics_.gold : labelMetrics_.at(labelId).gold;

  auto fullRecall = std::lower_bound(
      positiveCounts.begin(),
      positiveCounts.end(),
      golds,
      utils::compareFirstLess);

  if (fullRecall != positiveCounts.end()) {
    fullRecall = std::next(fullRecall);
  }

  for (auto it = positiveCounts.begin(); it != fullRecall; it++) {
    double precision = 0.0;
    double truePositives = it->first;
    double falsePositives = it->second;
    if (truePositives + falsePositives != 0.0) {
      precision = truePositives / (truePositives + falsePositives);
    }
    double recall = golds != 0 ? (truePositives / double(golds))
                               : std::numeric_limits<double>::quiet_NaN();
    precisionRecallCurve.emplace_back(precision, recall);
  }
  precisionRecallCurve.emplace_back(1.0, 0.0);

  return precisionRecallCurve;
}